

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O2

boolean goodpos(level *lev,int x,int y,monst *mtmp,uint gpflags)

{
  monst *pmVar1;
  boolean bVar2;
  uint uVar3;
  obj *poVar4;
  char cVar5;
  permonst *local_48;
  
  if (((uint)y < 0x15 && x - 1U < 0x4f) &&
     ((((mtmp == &youmonst || (u.ux != x)) || (u.uy != y)) ||
      (u.usteed == mtmp && u.usteed != (monst *)0x0)))) {
    cVar5 = (char)gpflags;
    if (mtmp == (monst *)0x0) {
      local_48 = (permonst *)0x0;
    }
    else {
      pmVar1 = lev->monsters[(uint)x][(uint)y];
      if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
        if (pmVar1 != mtmp) {
          return '\0';
        }
        if (mtmp->wormno != '\0') {
          return '\0';
        }
      }
      local_48 = mtmp->data;
      bVar2 = is_pool(lev,x,y);
      if ((-1 < cVar5) && (bVar2 != '\0')) {
        if (mtmp != &youmonst) {
          if ((local_48->mflags1 & 3) == 0) {
            return (byte)local_48->mflags1 >> 4 & 1;
          }
          return '\x01';
        }
        if (u.uprops[0x3c].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
          return '\x01';
        }
        if (((youmonst.data)->mflags1 & 1) != 0) {
          return '\x01';
        }
        if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 1) != 0)) {
          return '\x01';
        }
        if ((u.uprops[0x27].extrinsic != 0) &&
           (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) {
          return '\x01';
        }
        if (u.uprops[0x39].intrinsic != 0) {
          return '\x01';
        }
        if (u.uprops[0x39].extrinsic != 0) {
          return '\x01';
        }
        if (((youmonst.data)->mflags1 & 2) != 0) {
          return '\x01';
        }
        if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) != 0)) {
          return '\x01';
        }
        if (u.uprops[0x31].extrinsic != 0 || u.uprops[0x31].intrinsic != 0) {
          return '\x01';
        }
        uVar3 = (youmonst.data)->mflags1 & 0x600;
LAB_0024730a:
        return uVar3 != 0;
      }
      if (local_48->mlet == '9') {
        uVar3 = mt_random();
        if ((-1 < cVar5) && (uVar3 % 0xd != 0)) {
          return '\0';
        }
      }
      bVar2 = is_lava(lev,x,y);
      if (bVar2 != '\0') {
        uVar3 = u.uprops[0x12].intrinsic;
        if (mtmp != &youmonst) {
          return (local_48 == mons + 0x157 || local_48 == mons + 0xa0) | (byte)local_48->mflags1 & 1
          ;
        }
        goto LAB_0024730a;
      }
      if (((local_48->mflags1 & 8) != 0) &&
         (bVar2 = may_passwall(lev,(xchar)x,(xchar)y), bVar2 != '\0')) {
        return '\x01';
      }
    }
    if (lev->locations[(uint)x][(uint)y].typ < '\x17') {
      bVar2 = is_pool(lev,x,y);
      if (-1 < cVar5) {
        return '\0';
      }
      if (bVar2 == '\0') {
        return '\0';
      }
    }
    bVar2 = closed_door(lev,x,y);
    if (((bVar2 == '\0') || ((local_48 != (permonst *)0x0 && ((local_48->mflags1 & 4) != 0)))) &&
       ((poVar4 = sobj_at(0x214,lev,x,y), poVar4 == (obj *)0x0 ||
        ((local_48 != (permonst *)0x0 && ((local_48->mflags2 & 0x8000000) != 0)))))) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

boolean goodpos(struct level *lev, int x, int y, struct monst *mtmp, unsigned gpflags)
{
	const struct permonst *mdat = NULL;
	boolean ignorewater = ((gpflags & MM_IGNOREWATER) != 0);

	if (!isok(x, y)) return FALSE;

	/* in many cases, we're trying to create a new monster, which
	 * can't go on top of the player or any existing monster.
	 * however, occasionally we are relocating engravings or objects,
	 * which could be co-located and thus get restricted a bit too much.
	 * oh well.
	 */
	if (mtmp != &youmonst && x == u.ux && y == u.uy
			&& (!u.usteed || mtmp != u.usteed))
		return FALSE;

	if (mtmp) {
	    struct monst *mtmp2 = m_at(lev, x,y);

	    /* Be careful with long worms.  A monster may be placed back in
	     * its own location.  Normally, if m_at() returns the same monster
	     * that we're trying to place, the monster is being placed in its
	     * own location.  However, that is not correct for worm segments,
	     * because all the segments of the worm return the same m_at().
	     * Actually we overdo the check a little bit--a worm can't be placed
	     * in its own location, period.  If we just checked for mtmp->mx
	     * != x || mtmp->my != y, we'd miss the case where we're called
	     * to place the worm segment and the worm's head is at x,y.
	     */
	    if (mtmp2 && (mtmp2 != mtmp || mtmp->wormno))
		return FALSE;

	    mdat = mtmp->data;
	    if (is_pool(lev, x,y) && !ignorewater) {
		if (mtmp == &youmonst)
			return !!(HLevitation || Flying || Wwalking ||
					Swimming || Amphibious);
		else	return (is_flyer(mdat) || is_swimmer(mdat) ||
							is_clinger(mdat));
	    } else if (mdat->mlet == S_EEL && rn2(13) && !ignorewater) {
		return FALSE;
	    } else if (is_lava(lev, x,y)) {
		if (mtmp == &youmonst)
		    return !!HLevitation;
		else
		    return is_flyer(mdat) || likes_lava(mdat);
	    }
	    if (passes_walls(mdat) && may_passwall(lev, x,y)) return TRUE;
	}
	if (!ACCESSIBLE(lev->locations[x][y].typ)) {
		if (!(is_pool(lev, x,y) && ignorewater)) return FALSE;
	}

	if (closed_door(lev, x, y) && (!mdat || !amorphous(mdat)))
		return FALSE;
	if (sobj_at(BOULDER, lev, x, y) && (!mdat || !throws_rocks(mdat)))
		return FALSE;
	return TRUE;
}